

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearHash.h
# Opt level: O0

void __thiscall
LinearHash<int,_int>::LinearHash
          (LinearHash<int,_int> *this,ion_dictionary_id_t id,ion_key_type_t key_type,
          ion_key_size_t key_size,ion_value_size_t value_size,ion_dictionary_size_t dictionary_size)

{
  ion_dictionary_size_t dictionary_size_local;
  ion_value_size_t value_size_local;
  ion_key_size_t key_size_local;
  ion_key_type_t key_type_local;
  ion_dictionary_id_t id_local;
  LinearHash<int,_int> *this_local;
  
  linear_hash_dict_init((ion_dictionary_handler_t *)this);
  Dictionary<int,_int>::initializeDictionary
            (&this->super_Dictionary<int,_int>,id,key_type,key_size,value_size,dictionary_size);
  return;
}

Assistant:

LinearHash(
	ion_dictionary_id_t		id,
	ion_key_type_t			key_type,
	ion_key_size_t			key_size,
	ion_value_size_t		value_size,
	ion_dictionary_size_t	dictionary_size
) {
	linear_hash_dict_init(&this->handler);

	this->initializeDictionary(id, key_type, key_size, value_size, dictionary_size);
}